

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void ptls_log__recalc_point(int caller_locked,st_ptls_log_point_t *point)

{
  int iVar1;
  uint32_t new_active;
  uint uVar2;
  char **ppcVar3;
  size_t slot;
  long lVar4;
  
  if (caller_locked == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  }
  if ((point->state).generation != ptls_log._generation) {
    lVar4 = 0;
    ppcVar3 = &logctx.conns[0].points;
    uVar2 = 0;
    do {
      if (*ppcVar3 != (char *)0x0) {
        iVar1 = is_in_stringlist(*ppcVar3,point->name);
        if (iVar1 != 0) {
          uVar2 = uVar2 | 1 << ((uint)lVar4 & 0x1f);
        }
      }
      lVar4 = lVar4 + 1;
      ppcVar3 = ppcVar3 + 5;
    } while (lVar4 != 0x20);
    (point->state).active_conns = uVar2;
    (point->state).generation = ptls_log._generation;
  }
  if (caller_locked != 0) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
  return;
}

Assistant:

void ptls_log__recalc_point(int caller_locked, struct st_ptls_log_point_t *point)
{
    if (!caller_locked)
        pthread_mutex_lock(&logctx.mutex);

    if (point->state.generation != ptls_log._generation) {
        /* update active bitmap */
        uint32_t new_active = 0;
        for (size_t slot = 0; slot < PTLS_ELEMENTSOF(logctx.conns); ++slot)
            if (logctx.conns[slot].points != NULL && is_in_stringlist(logctx.conns[slot].points, point->name))
                new_active |= (uint32_t)1 << slot;
        point->state.active_conns = new_active;
        point->state.generation = ptls_log._generation;
    }

    if (!caller_locked)
        pthread_mutex_unlock(&logctx.mutex);
}